

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

plutovg_path_t * plutovg_path_clone(plutovg_path_t *path)

{
  plutovg_path_t *ppVar1;
  plutovg_path_element_t *ppVar2;
  int local_24;
  int local_20;
  int newcapacity;
  int capacity;
  plutovg_path_t *clone;
  plutovg_path_t *path_local;
  
  ppVar1 = plutovg_path_create();
  if (((path->elements).data != (plutovg_path_element_t *)0x0) && (0 < (path->elements).size)) {
    if ((ppVar1->elements).capacity < (ppVar1->elements).size + (path->elements).size) {
      if ((ppVar1->elements).capacity == 0) {
        local_24 = 8;
      }
      else {
        local_24 = (ppVar1->elements).capacity;
      }
      for (local_20 = local_24; local_20 < (ppVar1->elements).size + (path->elements).size;
          local_20 = local_20 << 1) {
      }
      ppVar2 = (plutovg_path_element_t *)realloc((ppVar1->elements).data,(long)local_20 << 3);
      (ppVar1->elements).data = ppVar2;
      (ppVar1->elements).capacity = local_20;
    }
    memcpy((ppVar1->elements).data + (ppVar1->elements).size,(path->elements).data,
           (long)(path->elements).size << 3);
    (ppVar1->elements).size = (path->elements).size + (ppVar1->elements).size;
  }
  ppVar1->start_point = path->start_point;
  ppVar1->num_points = path->num_points;
  ppVar1->num_contours = path->num_contours;
  ppVar1->num_curves = path->num_curves;
  return ppVar1;
}

Assistant:

plutovg_path_t* plutovg_path_clone(const plutovg_path_t* path)
{
    plutovg_path_t* clone = plutovg_path_create();
    plutovg_array_append(clone->elements, path->elements);
    clone->start_point = path->start_point;
    clone->num_points = path->num_points;
    clone->num_contours = path->num_contours;
    clone->num_curves = path->num_curves;
    return clone;
}